

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void match_ref_frame(MB_MODE_INFO *mbmi,MV_REFERENCE_FRAME *ref_frames,int *is_ref_match)

{
  int iVar1;
  uint *in_RDX;
  MB_MODE_INFO *in_RSI;
  MB_MODE_INFO *in_RDI;
  
  iVar1 = is_inter_block(in_RSI);
  if (iVar1 != 0) {
    *in_RDX = (uint)(in_RSI->bsize == in_RDI->ref_frame[0]) | *in_RDX;
    in_RDX[1] = (uint)(in_RSI->partition == in_RDI->ref_frame[0]) | in_RDX[1];
    iVar1 = has_second_ref(in_RDI);
    if (iVar1 != 0) {
      *in_RDX = (uint)(in_RSI->bsize == in_RDI->ref_frame[1]) | *in_RDX;
      in_RDX[1] = (uint)(in_RSI->partition == in_RDI->ref_frame[1]) | in_RDX[1];
    }
  }
  return;
}

Assistant:

static inline void match_ref_frame(const MB_MODE_INFO *const mbmi,
                                   const MV_REFERENCE_FRAME *ref_frames,
                                   int *const is_ref_match) {
  if (is_inter_block(mbmi)) {
    is_ref_match[0] |= ref_frames[0] == mbmi->ref_frame[0];
    is_ref_match[1] |= ref_frames[1] == mbmi->ref_frame[0];
    if (has_second_ref(mbmi)) {
      is_ref_match[0] |= ref_frames[0] == mbmi->ref_frame[1];
      is_ref_match[1] |= ref_frames[1] == mbmi->ref_frame[1];
    }
  }
}